

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  ImDrawChannel *pIVar1;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ImDrawCmd *pIVar7;
  unsigned_short *puVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  
  if (1 < this->_ChannelsCount) {
    iVar14 = 0;
    ChannelsSetCurrent(this,0);
    uVar6 = (this->CmdBuffer).Size;
    uVar9 = 0;
    if ((ulong)uVar6 != 0) {
      if ((int)uVar6 < 1) {
LAB_0013d964:
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                      ,0x365,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
      }
      uVar9 = uVar6;
      if ((this->CmdBuffer).Data[(ulong)uVar6 - 1].ElemCount == 0) {
        (this->CmdBuffer).Size = uVar6 - 1;
        uVar9 = uVar6 - 1;
      }
    }
    iVar11 = this->_ChannelsCount;
    iVar4 = 0;
    if (1 < (long)iVar11) {
      uVar6 = (this->_Channels).Size;
      pIVar1 = (this->_Channels).Data;
      uVar3 = 1;
      if (1 < (int)uVar6) {
        uVar3 = (ulong)uVar6;
      }
      iVar4 = 0;
      lVar5 = 0x20;
      iVar14 = 0;
      do {
        if (uVar3 * 0x20 == lVar5) goto LAB_0013d945;
        uVar6 = *(uint *)((long)&(pIVar1->CmdBuffer).Size + lVar5);
        if ((ulong)uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          if ((int)uVar6 < 1) goto LAB_0013d964;
          if (*(int *)(*(long *)((long)&(pIVar1->CmdBuffer).Data + lVar5) + -0x30 +
                      (ulong)uVar6 * 0x30) == 0) {
            uVar6 = uVar6 - 1;
            *(uint *)((long)&(pIVar1->CmdBuffer).Size + lVar5) = uVar6;
          }
        }
        iVar4 = iVar4 + uVar6;
        iVar14 = iVar14 + *(int *)((long)&(pIVar1->IdxBuffer).Size + lVar5);
        lVar5 = lVar5 + 0x20;
      } while ((long)iVar11 * 0x20 != lVar5);
      uVar9 = (this->CmdBuffer).Size;
    }
    iVar10 = uVar9 + iVar4;
    iVar11 = (this->CmdBuffer).Capacity;
    if (iVar11 < iVar10) {
      if (iVar11 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar11 / 2 + iVar11;
      }
      if (iVar11 <= iVar10) {
        iVar11 = iVar10;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar11 * 0x30);
      pIVar7 = (this->CmdBuffer).Data;
      if (pIVar7 == (ImDrawCmd *)0x0) {
        pIVar7 = (ImDrawCmd *)0x0;
      }
      else {
        memcpy(__dest,pIVar7,(long)(this->CmdBuffer).Size * 0x30);
        pIVar7 = (this->CmdBuffer).Data;
      }
      ImGui::MemFree(pIVar7);
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar11;
    }
    (this->CmdBuffer).Size = iVar10;
    lVar5 = (long)(this->IdxBuffer).Size + (long)iVar14;
    iVar11 = (this->IdxBuffer).Capacity;
    iVar12 = (int)lVar5;
    if (iVar11 < iVar12) {
      if (iVar11 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar11 / 2 + iVar11;
      }
      if (iVar11 <= iVar12) {
        iVar11 = iVar12;
      }
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar11 * 2);
      puVar8 = (this->IdxBuffer).Data;
      if (puVar8 == (unsigned_short *)0x0) {
        puVar8 = (unsigned_short *)0x0;
      }
      else {
        memcpy(__dest_00,puVar8,(long)(this->IdxBuffer).Size * 2);
        puVar8 = (this->IdxBuffer).Data;
      }
      ImGui::MemFree(puVar8);
      (this->IdxBuffer).Data = __dest_00;
      (this->IdxBuffer).Capacity = iVar11;
      iVar10 = (this->CmdBuffer).Size;
    }
    else {
      __dest_00 = (this->IdxBuffer).Data;
    }
    (this->IdxBuffer).Size = iVar12;
    pIVar7 = (this->CmdBuffer).Data;
    this->_IdxWritePtr = __dest_00 + (lVar5 - iVar14);
    if (1 < this->_ChannelsCount) {
      pIVar7 = pIVar7 + ((long)iVar10 - (long)iVar4);
      lVar5 = 1;
      lVar13 = 0x38;
      do {
        if ((this->_Channels).Size <= lVar5) {
LAB_0013d945:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                        ,0x35b,
                        "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar1 = (this->_Channels).Data;
        lVar2 = (long)*(int *)((long)pIVar1 + lVar13 + -0x18);
        if (lVar2 != 0) {
          memcpy(pIVar7,*(void **)((long)pIVar1 + lVar13 + -0x10),lVar2 * 0x30);
          pIVar7 = pIVar7 + lVar2;
        }
        lVar2 = (long)*(int *)((long)pIVar1 + lVar13 + -8);
        if (lVar2 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar1->CmdBuffer).Size + lVar13),lVar2 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar2;
        }
        lVar5 = lVar5 + 1;
        lVar13 = lVar13 + 0x20;
      } while (lVar5 < this->_ChannelsCount);
    }
    AddDrawCmd(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    AddDrawCmd();
    _ChannelsCount = 1;
}